

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::Server::routing(Server *this,Request *req,Response *res,Stream *strm,bool last_connection)

{
  bool bVar1;
  Handlers *handlers;
  ContentReader *this_00;
  ContentReader reader;
  bool local_1c1;
  MultipartReader local_1c0;
  Reader local_1a0;
  ContentReader local_180;
  ContentReader local_140;
  ContentReader local_100;
  ContentReader local_c0;
  anon_class_40_5_0abb3629 local_80;
  anon_class_40_5_0abb3629 local_58;
  
  local_1c1 = last_connection;
  bVar1 = std::operator==(&req->method,"GET");
  if ((bVar1) && (bVar1 = handle_file_request(this,req,res), bVar1)) {
    return true;
  }
  bVar1 = detail::expect_content(req);
  if (!bVar1) goto LAB_0011df47;
  local_58.this = this;
  local_58.strm = strm;
  local_58.last_connection = &local_1c1;
  local_58.req = req;
  local_58.res = res;
  std::function<bool(std::function<bool(char_const*,unsigned_long)>)>::
  function<httplib::Server::routing(httplib::Request&,httplib::Response&,httplib::Stream&,bool)::_lambda(std::function<bool(char_const*,unsigned_long)>)_1_,void>
            ((function<bool(std::function<bool(char_const*,unsigned_long)>)> *)&local_1a0,&local_58)
  ;
  local_80.this = this;
  local_80.strm = strm;
  local_80.last_connection = &local_1c1;
  local_80.req = req;
  local_80.res = res;
  std::
  function<bool(std::function<bool(httplib::MultipartFormData_const&)>,std::function<bool(char_const*,unsigned_long)>)>
  ::
  function<httplib::Server::routing(httplib::Request&,httplib::Response&,httplib::Stream&,bool)::_lambda(std::function<bool(httplib::MultipartFormData_const&)>,std::function<bool(char_const*,unsigned_long)>)_1_,void>
            ((function<bool(std::function<bool(httplib::MultipartFormData_const&)>,std::function<bool(char_const*,unsigned_long)>)>
              *)&local_1c0,&local_80);
  ContentReader::ContentReader(&local_180,&local_1a0,&local_1c0);
  std::_Function_base::~_Function_base(&local_1c0.super__Function_base);
  std::_Function_base::~_Function_base(&local_1a0.super__Function_base);
  bVar1 = std::operator==(&req->method,"POST");
  if (bVar1) {
    ContentReader::ContentReader(&local_c0,&local_180);
    bVar1 = dispatch_request_for_content_reader
                      (this,req,res,&local_c0,&this->post_handlers_for_content_reader_);
    this_00 = &local_c0;
LAB_0011df07:
    ContentReader::~ContentReader(this_00);
    if (bVar1 != false) {
      ContentReader::~ContentReader(&local_180);
      return true;
    }
  }
  else {
    bVar1 = std::operator==(&req->method,"PUT");
    if (bVar1) {
      ContentReader::ContentReader(&local_100,&local_180);
      bVar1 = dispatch_request_for_content_reader
                        (this,req,res,&local_100,&this->put_handlers_for_content_reader_);
      this_00 = &local_100;
      goto LAB_0011df07;
    }
    bVar1 = std::operator==(&req->method,"PATCH");
    if (bVar1) {
      ContentReader::ContentReader(&local_140,&local_180);
      bVar1 = dispatch_request_for_content_reader
                        (this,req,res,&local_140,&this->patch_handlers_for_content_reader_);
      this_00 = &local_140;
      goto LAB_0011df07;
    }
  }
  ContentReader::~ContentReader(&local_180);
  bVar1 = read_content(this,strm,local_1c1,req,res);
  if (!bVar1) {
    return false;
  }
LAB_0011df47:
  bVar1 = std::operator==(&req->method,"GET");
  if ((bVar1) || (bVar1 = std::operator==(&req->method,"HEAD"), bVar1)) {
    handlers = &this->get_handlers_;
  }
  else {
    bVar1 = std::operator==(&req->method,"POST");
    if (bVar1) {
      handlers = &this->post_handlers_;
    }
    else {
      bVar1 = std::operator==(&req->method,"PUT");
      if (bVar1) {
        handlers = &this->put_handlers_;
      }
      else {
        bVar1 = std::operator==(&req->method,"DELETE");
        if (bVar1) {
          handlers = &this->delete_handlers_;
        }
        else {
          bVar1 = std::operator==(&req->method,"OPTIONS");
          if (bVar1) {
            handlers = &this->options_handlers_;
          }
          else {
            bVar1 = std::operator==(&req->method,"PATCH");
            if (!bVar1) {
              res->status = 400;
              return false;
            }
            handlers = &this->patch_handlers_;
          }
        }
      }
    }
  }
  bVar1 = dispatch_request(this,req,res,handlers);
  return bVar1;
}

Assistant:

inline bool Server::routing(Request &req, Response &res, Stream &strm,
                            bool last_connection) {
  // File handler
  if (req.method == "GET" && handle_file_request(req, res)) { return true; }

  if (detail::expect_content(req)) {
    // Content reader handler
    {
      ContentReader reader(
          [&](ContentReceiver receiver) {
            return read_content_with_content_receiver(
                strm, last_connection, req, res, receiver, nullptr, nullptr);
          },
          [&](MultipartContentHeader header, ContentReceiver receiver) {
            return read_content_with_content_receiver(
                strm, last_connection, req, res, nullptr, header, receiver);
          });

      if (req.method == "POST") {
        if (dispatch_request_for_content_reader(
                req, res, reader, post_handlers_for_content_reader_)) {
          return true;
        }
      } else if (req.method == "PUT") {
        if (dispatch_request_for_content_reader(
                req, res, reader, put_handlers_for_content_reader_)) {
          return true;
        }
      } else if (req.method == "PATCH") {
        if (dispatch_request_for_content_reader(
                req, res, reader, patch_handlers_for_content_reader_)) {
          return true;
        }
      }
    }

    // Read content into `req.body`
    if (!read_content(strm, last_connection, req, res)) { return false; }
  }

  // Regular handler
  if (req.method == "GET" || req.method == "HEAD") {
    return dispatch_request(req, res, get_handlers_);
  } else if (req.method == "POST") {
    return dispatch_request(req, res, post_handlers_);
  } else if (req.method == "PUT") {
    return dispatch_request(req, res, put_handlers_);
  } else if (req.method == "DELETE") {
    return dispatch_request(req, res, delete_handlers_);
  } else if (req.method == "OPTIONS") {
    return dispatch_request(req, res, options_handlers_);
  } else if (req.method == "PATCH") {
    return dispatch_request(req, res, patch_handlers_);
  }

  res.status = 400;
  return false;
}